

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O3

int sfd_tran_ep_set_recvmaxsz(void *arg,void *v,size_t sz,nni_opt_type t)

{
  int iVar1;
  uint64_t local_20;
  size_t val;
  
  iVar1 = nni_copyin_size(&local_20,v,sz,0,0xffffffff,t);
  if (iVar1 == 0) {
    nni_mtx_lock((nni_mtx *)arg);
    *(uint64_t *)((long)arg + 0x30) = local_20;
    nni_mtx_unlock((nni_mtx *)arg);
    nni_stat_set_value((nni_stat_item *)((long)arg + 0x2d8),local_20);
  }
  return iVar1;
}

Assistant:

static int
sfd_tran_ep_set_recvmaxsz(void *arg, const void *v, size_t sz, nni_opt_type t)
{
	sfd_tran_ep *ep = arg;
	size_t       val;
	int          rv;
	if ((rv = nni_copyin_size(&val, v, sz, 0, NNI_MAXSZ, t)) == 0) {
		nni_mtx_lock(&ep->mtx);
		ep->rcvmax = val;
		nni_mtx_unlock(&ep->mtx);
#ifdef NNG_ENABLE_STATS
		nni_stat_set_value(&ep->st_rcv_max, val);
#endif
	}
	return (rv);
}